

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O3

int testString(int param_1,char **param_2)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  string *psVar5;
  int iVar6;
  uint uVar7;
  String str;
  String local_58;
  String local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testConstructDefault()\n",0x17);
  local_58.view_._M_len = 0;
  local_58.view_._M_str = (char *)0x0;
  local_58.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_58.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = cm::String::is_stable(&local_58);
  if (bVar1) {
    pcVar3 = cm::String::c_str(&local_58);
    if (pcVar3 == (char *)0x0) {
      psVar5 = cm::String::str_abi_cxx11_(&local_58);
      if (psVar5->_M_string_length == 0) {
        bVar2 = cm::String::is_stable(&local_58);
        bVar1 = true;
        if (bVar2) goto LAB_001c1527;
        iVar6 = 0x25;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(str.is_stable()) failed on line ",0x2c);
      }
      else {
        iVar6 = 0x24;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(str.str().empty()) failed on line ",0x2e);
      }
    }
    else {
      iVar6 = 0x23;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.c_str() == nullptr) failed on line ",0x33);
    }
  }
  else {
    iVar6 = 0x22;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str_const.is_stable()) failed on line ",0x32);
  }
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  bVar1 = false;
LAB_001c1527:
  if (local_58.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  uVar7 = 1;
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"testConstructFromNullPtr()\n",0x1b);
    local_58.string_.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_58.string_.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58.view_._M_len = 0;
    local_58.view_._M_str = (char *)0x0;
    bVar1 = testFromNullPtr(&local_58);
    if (local_58.string_.
        super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.string_.
                 super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"testConstructFromCStrNull()\n",0x1c);
      cm::IntoString<char_*>::into_string(&local_58,(char *)0x0);
      local_38.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_58.string_.
                super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_38.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           local_58.string_.
           super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_38.view_._M_len = local_58.view_._M_len;
      local_38.view_._M_str = local_58.view_._M_str;
      bVar1 = testFromCStrNull(&local_38);
      if (local_38.string_.
          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.string_.
                   super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"testConstructFromCharArray()\n",0x1d);
        cm::String::String<char_const(&)[4],void>(&local_58,(char (*) [4])"abc");
        bVar1 = testFromCharArray(&local_58);
        if (local_58.string_.
            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.string_.
                     super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"testConstructFromCStr()\n",0x18);
          cm::IntoString<char_*>::into_string(&local_58,cstr);
          local_38.string_.
          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_58.string_.
                    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          local_38.string_.
          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               local_58.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_38.view_._M_len = local_58.view_._M_len;
          local_38.view_._M_str = local_58.view_._M_str;
          bVar1 = testFromCStr(&local_38);
          if (local_38.string_.
              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_38.string_.
                       super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"testConstructFromStdString()\n",0x1d);
            cm::String::String<std::__cxx11::string_const&,void>(&local_58,&stdstr_abi_cxx11_);
            bVar1 = testFromStdString(&local_58);
            if (local_58.string_.
                super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_58.string_.
                         super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if (bVar1) {
              bVar1 = testConstructFromView();
              if (bVar1) {
                bVar1 = testConstructFromChar();
                if (bVar1) {
                  bVar1 = testConstructFromInitList();
                  if (bVar1) {
                    bVar1 = testConstructFromBuffer();
                    if (bVar1) {
                      bVar1 = testConstructFromInputIterator();
                      if (bVar1) {
                        bVar1 = testConstructFromN();
                        if (bVar1) {
                          bVar1 = testConstructFromStaticStringView();
                          if (bVar1) {
                            bVar1 = testConstructCopy();
                            if (bVar1) {
                              bVar1 = testConstructMove();
                              if (bVar1) {
                                bVar1 = testAssignCopy();
                                if (bVar1) {
                                  bVar1 = testAssignMove();
                                  if (bVar1) {
                                    bVar1 = testAssignFromChar();
                                    if (bVar1) {
                                      bVar1 = testAssignFromView();
                                      if (bVar1) {
                                        bVar1 = testAssignFromStdString();
                                        if (bVar1) {
                                          bVar1 = testAssignFromCStr();
                                          if (bVar1) {
                                            bVar1 = testAssignFromCharArray();
                                            if (bVar1) {
                                              bVar1 = testAssignFromCStrNull();
                                              if (bVar1) {
                                                bVar1 = testAssignFromNullPtr();
                                                if (bVar1) {
                                                  bVar1 = testAssignFromInitList();
                                                  if (bVar1) {
                                                    bVar1 = testAssignFromStaticStringView();
                                                    if (bVar1) {
                                                      bVar1 = testOperatorBool();
                                                      if (bVar1) {
                                                        bVar1 = testOperatorIndex();
                                                        if (bVar1) {
                                                          bVar1 = testOperatorPlusEqual();
                                                          if (bVar1) {
                                                            bVar1 = testOperatorCompare();
                                                            if (bVar1) {
                                                              bVar1 = testOperatorStream();
                                                              if (bVar1) {
                                                                bVar1 = 
                                                  testOperatorStdStringPlusEqual();
                                                  if (bVar1) {
                                                    bVar1 = testMethod_borrow();
                                                    if (bVar1) {
                                                      bVar1 = testMethod_view();
                                                      if (bVar1) {
                                                        bVar1 = testMethod_empty();
                                                        if (bVar1) {
                                                          bVar1 = testMethod_length();
                                                          if (bVar1) {
                                                            bVar1 = testMethod_at();
                                                            if (bVar1) {
                                                              bVar1 = testMethod_front_back();
                                                              if (bVar1) {
                                                                bVar1 = testMethod_clear();
                                                                if (bVar1) {
                                                                  bVar1 = testMethod_insert();
                                                                  if (bVar1) {
                                                                    bVar1 = testMethod_erase();
                                                                    if (bVar1) {
                                                                      bVar1 = testMethod_push_back()
                                                                      ;
                                                                      if (bVar1) {
                                                                        bVar1 = testMethod_pop_back(
                                                  );
                                                  if (bVar1) {
                                                    bVar1 = testMethod_replace();
                                                    if (bVar1) {
                                                      bVar1 = testMethod_copy();
                                                      if (bVar1) {
                                                        bVar1 = testMethod_resize();
                                                        if (bVar1) {
                                                          bVar1 = testMethod_swap();
                                                          if (bVar1) {
                                                            bVar1 = testMethodIterators();
                                                            if (bVar1) {
                                                              bVar1 = 
                                                  testMethod_substr_AtEndBorrowed();
                                                  if (bVar1) {
                                                    bVar1 = testMethod_substr_AtEndOwned();
                                                    if (bVar1) {
                                                      bVar1 = testMethod_substr_AtStartBorrowed();
                                                      if (bVar1) {
                                                        bVar1 = testMethod_substr_AtStartOwned();
                                                        if (bVar1) {
                                                          bVar1 = testMethod_compare();
                                                          if (bVar1) {
                                                            bVar1 = testMethod_find();
                                                            if (bVar1) {
                                                              bVar1 = testMethod_rfind();
                                                              if (bVar1) {
                                                                bVar1 = testMethod_find_first_of();
                                                                if (bVar1) {
                                                                  bVar1 = 
                                                  testMethod_find_first_not_of();
                                                  if (bVar1) {
                                                    bVar1 = testMethod_find_last_of();
                                                    if (bVar1) {
                                                      bVar1 = testMethod_find_last_not_of();
                                                      if (bVar1) {
                                                        bVar1 = testAddition();
                                                        if (bVar1) {
                                                          bVar1 = testStability();
                                                          uVar7 = (uint)!bVar1;
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar7;
}

Assistant:

static bool testMethod_front_back()
{
  std::cout << "testMethod_front_back()\n";
  cm::String str = "abc";
  ASSERT_TRUE(str.front() == 'a');
  ASSERT_TRUE(str.back() == 'c');
  return true;
}